

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_posix::utf8_converter::convert_abi_cxx11_
          (string *__return_storage_ptr__,utf8_converter *this,conversion_type how,char *begin,
          char *end,int param_4)

{
  uint uVar1;
  wstring wres;
  wstring tmp;
  allocator local_81;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  string local_40;
  
  if (how - lower_case < 2) {
    std::__cxx11::string::string((string *)&local_80,"UTF-8",(allocator *)&local_40);
    conv::to_utf<wchar_t>(&local_60,begin,end,(string *)&local_80,default_method);
    std::__cxx11::string::~string((string *)&local_80);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)&local_80);
    for (uVar1 = 0; uVar1 < local_60._M_string_length; uVar1 = uVar1 + 1) {
      towlower_l(local_60._M_dataplus._M_p[uVar1],
                 (__locale_t)
                 *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
      std::__cxx11::wstring::push_back((wchar_t)&local_80);
    }
    std::__cxx11::string::string((string *)&local_40,"UTF-8",&local_81);
    conv::from_utf<wchar_t>(__return_storage_ptr__,&local_80,&local_40,default_method);
  }
  else {
    if (how != upper_case) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,begin,end);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_80,"UTF-8",(allocator *)&local_40);
    conv::to_utf<wchar_t>(&local_60,begin,end,(string *)&local_80,default_method);
    std::__cxx11::string::~string((string *)&local_80);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)&local_80);
    for (uVar1 = 0; uVar1 < local_60._M_string_length; uVar1 = uVar1 + 1) {
      towupper_l(local_60._M_dataplus._M_p[uVar1],
                 (__locale_t)
                 *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
      std::__cxx11::wstring::push_back((wchar_t)&local_80);
    }
    std::__cxx11::string::string((string *)&local_40,"UTF-8",&local_81);
    conv::from_utf<wchar_t>(__return_storage_ptr__,&local_80,&local_40,default_method);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_80);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case upper_case:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                std::wstring wres;
                wres.reserve(tmp.size());
                for(unsigned i=0;i<tmp.size();i++)
                    wres+=towupper_l(tmp[i],*lc_);
                return conv::from_utf<wchar_t>(wres,"UTF-8");
            }
            
        case lower_case:
        case case_folding:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                std::wstring wres;
                wres.reserve(tmp.size());
                for(unsigned i=0;i<tmp.size();i++)
                    wres+=towlower_l(tmp[i],*lc_);
                return conv::from_utf<wchar_t>(wres,"UTF-8");
            }
        default:
            return std::string(begin,end-begin);
        }
    }